

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O0

void setlock(int argc,char **argv)

{
  char *f;
  int iVar1;
  char **ppcVar2;
  char *fn;
  uint local_20;
  uint x;
  uint delay;
  int opt;
  char **argv_local;
  int argc_local;
  
  local_20 = 0;
  fn._4_4_ = 0;
  while (iVar1 = sgetoptmine(argc,argv,"nNxX"), iVar1 != subgetoptdone) {
    if (iVar1 == 0x4e) {
      local_20 = 0;
    }
    else if (iVar1 == 0x58) {
      fn._4_4_ = 0;
    }
    else if (iVar1 == 0x6e) {
      local_20 = 1;
    }
    else if (iVar1 == 0x78) {
      fn._4_4_ = 1;
    }
    else {
      setlock_usage();
    }
  }
  ppcVar2 = argv + subgetoptind;
  f = *ppcVar2;
  if (f == (char *)0x0) {
    setlock_usage();
  }
  if (ppcVar2[1] == (char *)0x0) {
    setlock_usage();
  }
  slock(f,local_20,fn._4_4_);
  pathexec(ppcVar2 + 1);
  if (fn._4_4_ == 0) {
    fatal2("unable to run",ppcVar2[1]);
  }
  _exit(0);
}

Assistant:

void setlock(int argc, const char *const *argv) {
  int opt;
  unsigned int delay =0;
  unsigned int x =0;
  const char *fn;

  while ((opt =getopt(argc, argv, "nNxX")) != opteof)
    switch(opt) {
      case 'n': delay =1; break;
      case 'N': delay =0; break;
      case 'x': x =1; break;
      case 'X': x =0; break;
      default: setlock_usage();
    }
  argv +=optind;
  if (! (fn =*argv)) setlock_usage();
  if (! *++argv) setlock_usage();

  slock(fn, delay, x);
  pathexec(argv);
  if (! x) fatal2("unable to run", *argv);
  _exit(0);
}